

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedWrite::pumpTo
          (BlockedWrite *this,AsyncOutputStream *output,uint64_t amount)

{
  ArrayDisposer *params;
  Detail *pDVar1;
  PromiseArena *pPVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  long lVar5;
  Promise<void> PVar6;
  OwnPromiseNode OVar7;
  void *pvVar8;
  RemoveConst<kj::Exception::Detail> *in_RCX;
  _func_int **pp_Var9;
  long lVar10;
  RemoveConst<kj::Exception::Detail> *pRVar11;
  long lVar12;
  _func_int *p_Var13;
  TransformPromiseNodeBase *pTVar14;
  Fault FVar15;
  RemoveConst<kj::Exception::Detail> *pRVar16;
  _func_int **pp_Var17;
  _func_int **pp_Var18;
  bool bVar19;
  Promise<void> promise;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_c7;
  OwnPromiseNode intermediate;
  OwnPromiseNode local_88;
  Fault f;
  OwnPromiseNode local_48;
  OwnPromiseNode local_40;
  uint64_t n;
  
  bVar19 = output[0xc]._vptr_AsyncOutputStream == (_func_int **)0x0;
  _kjCondition.value = bVar19;
  if (!bVar19) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,600,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&f);
  }
  params = (ArrayDisposer *)(output + 0xc);
  pRVar16 = (RemoveConst<kj::Exception::Detail> *)output[5]._vptr_AsyncOutputStream;
  if (in_RCX < pRVar16) {
    (*(code *)**(undefined8 **)amount)(&_kjCondition,amount,output[4]._vptr_AsyncOutputStream);
    FVar15.exception = __kjCondition;
    pDVar1 = (Detail *)output[2]._vptr_AsyncOutputStream;
    pPVar2 = (PromiseArena *)(__kjCondition->ownFile).content.size_;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)__kjCondition - (long)pPVar2) < 0x40) {
      pvVar8 = operator_new(0x400);
      pTVar14 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3c0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar14,(OwnPromiseNode *)&_kjCondition,
                 kj::_::
                 TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:605:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
                 ::anon_class_16_2_34952053_for_func::operator());
      *(undefined ***)((long)pvVar8 + 0x3c0) = &PTR_destroy_006473e0;
      *(AsyncOutputStream **)((long)pvVar8 + 0x3e0) = output;
      *(RemoveConst<kj::Exception::Detail> **)((long)pvVar8 + 1000) = in_RCX;
      *(Detail **)((long)pvVar8 + 0x3f0) = pDVar1;
      *(ArrayDisposer **)((long)pvVar8 + 0x3f8) = params;
      *(void **)((long)pvVar8 + 0x3c8) = pvVar8;
    }
    else {
      (__kjCondition->ownFile).content.size_ = 0;
      pTVar14 = (TransformPromiseNodeBase *)(__kjCondition[-1].trace + 0x1d);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar14,(OwnPromiseNode *)&_kjCondition,
                 kj::_::
                 TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:605:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
                 ::anon_class_16_2_34952053_for_func::operator());
      FVar15.exception[-1].trace[0x1d] = &PTR_destroy_006473e0;
      FVar15.exception[-1].details.builder.ptr = (Detail *)output;
      FVar15.exception[-1].details.builder.pos = in_RCX;
      FVar15.exception[-1].details.builder.endPtr = pDVar1;
      FVar15.exception[-1].details.builder.disposer = params;
      FVar15.exception[-1].trace[0x1e] = pPVar2;
    }
    local_40.ptr = &pTVar14->super_PromiseNode;
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_long>>
              ((PromiseDisposer *)&f,(Canceler *)params,(Promise<unsigned_long> *)&local_40);
    OVar7.ptr = local_40.ptr;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)f.exception;
    if ((TransformPromiseNodeBase *)local_40.ptr != (TransformPromiseNodeBase *)0x0) {
      local_40.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar7.ptr)->super_PromiseArenaMember);
    }
    FVar15.exception = __kjCondition;
    if (__kjCondition == (Exception *)0x0) {
      return (PromiseBase)(PromiseBase)this;
    }
    __kjCondition = (Exception *)0x0;
  }
  else {
    pp_Var3 = output[7]._vptr_AsyncOutputStream;
    if (pp_Var3 == (_func_int **)0x0) {
      pp_Var18 = (_func_int **)0x0;
    }
    else {
      pp_Var9 = output[6]._vptr_AsyncOutputStream + 1;
      pp_Var17 = (_func_int **)0x0;
      do {
        pRVar11 = (RemoveConst<kj::Exception::Detail> *)(*pp_Var9 + (long)pRVar16);
        pp_Var18 = pp_Var17;
        if (in_RCX < pRVar11) break;
        pp_Var17 = (_func_int **)((long)pp_Var17 + 1);
        pp_Var9 = pp_Var9 + 2;
        pRVar16 = pRVar11;
        pp_Var18 = pp_Var3;
      } while (pp_Var3 != pp_Var17);
    }
    (*(code *)**(undefined8 **)amount)
              (&promise,amount,output[4]._vptr_AsyncOutputStream,output[5]._vptr_AsyncOutputStream);
    PVar6 = promise;
    if (pp_Var18 != (_func_int **)0x0) {
      pp_Var3 = output[6]._vptr_AsyncOutputStream;
      lVar10 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
      if (lVar10 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar10) < 0x38) {
        pvVar8 = operator_new(0x400);
        pTVar14 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3c8);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar14,(OwnPromiseNode *)&promise,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:626:32)>
                   ::anon_class_24_2_d8a1eacd_for_func::operator());
        *(undefined ***)((long)pvVar8 + 0x3c8) = &PTR_destroy_00647438;
        *(uint64_t *)((long)pvVar8 + 1000) = amount;
        *(_func_int ***)((long)pvVar8 + 0x3f0) = pp_Var3;
        *(_func_int ***)((long)pvVar8 + 0x3f8) = pp_Var18;
        *(void **)((long)pvVar8 + 0x3d0) = pvVar8;
      }
      else {
        *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
        pTVar14 = (TransformPromiseNodeBase *)((long)promise.super_PromiseBase.node.ptr + -0x38);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar14,(OwnPromiseNode *)&promise,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:626:32)>
                   ::anon_class_24_2_d8a1eacd_for_func::operator());
        *(undefined ***)((long)PVar6.super_PromiseBase.node.ptr + -0x38) = &PTR_destroy_00647438;
        *(uint64_t *)((long)PVar6.super_PromiseBase.node.ptr + -0x18) = amount;
        *(_func_int ***)((long)PVar6.super_PromiseBase.node.ptr + -0x10) = pp_Var3;
        *(_func_int ***)((long)PVar6.super_PromiseBase.node.ptr + -8) = pp_Var18;
        *(long *)((long)PVar6.super_PromiseBase.node.ptr + -0x30) = lVar10;
      }
      f.exception = (Exception *)&DAT_004a8171;
      intermediate.ptr = &pTVar14->super_PromiseNode;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                ((PromiseDisposer *)&_kjCondition,&intermediate,(SourceLocation *)&f);
      OVar7.ptr = intermediate.ptr;
      FVar15.exception = __kjCondition;
      if (intermediate.ptr != (PromiseNode *)0x0) {
        intermediate.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar7.ptr)->super_PromiseArenaMember);
      }
      PVar6.super_PromiseBase.node.ptr = promise.super_PromiseBase.node.ptr;
      promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)FVar15.exception;
      if (PVar6.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar6.super_PromiseBase.node.ptr);
      }
    }
    PVar6.super_PromiseBase.node.ptr = promise.super_PromiseBase.node.ptr;
    pp_Var3 = output[7]._vptr_AsyncOutputStream;
    if (pp_Var18 == pp_Var3) {
      pp_Var3 = output[2]._vptr_AsyncOutputStream;
      lVar10 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
      if (lVar10 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar10) < 0x50) {
        pvVar8 = operator_new(0x400);
        pTVar14 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3b0);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar14,(OwnPromiseNode *)&promise,
                   kj::_::
                   TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:631:43),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                   ::anon_class_32_4_246a692a_for_func::operator());
        *(undefined ***)((long)pvVar8 + 0x3b0) = &PTR_destroy_006474e8;
        *(AsyncOutputStream **)((long)pvVar8 + 0x3d0) = output;
        *(uint64_t *)((long)pvVar8 + 0x3d8) = amount;
        *(RemoveConst<kj::Exception::Detail> **)((long)pvVar8 + 0x3e0) = in_RCX;
        *(RemoveConst<kj::Exception::Detail> **)((long)pvVar8 + 1000) = pRVar16;
        *(_func_int ***)((long)pvVar8 + 0x3f0) = pp_Var3;
        *(ArrayDisposer **)((long)pvVar8 + 0x3f8) = params;
        *(void **)((long)pvVar8 + 0x3b8) = pvVar8;
      }
      else {
        *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
        pTVar14 = (TransformPromiseNodeBase *)((long)promise.super_PromiseBase.node.ptr + -0x50);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar14,(OwnPromiseNode *)&promise,
                   kj::_::
                   TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:631:43),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                   ::anon_class_32_4_246a692a_for_func::operator());
        *(undefined ***)((long)PVar6.super_PromiseBase.node.ptr + -0x50) = &PTR_destroy_006474e8;
        *(AsyncOutputStream **)((long)PVar6.super_PromiseBase.node.ptr + -0x30) = output;
        *(uint64_t *)((long)PVar6.super_PromiseBase.node.ptr + -0x28) = amount;
        *(RemoveConst<kj::Exception::Detail> **)((long)PVar6.super_PromiseBase.node.ptr + -0x20) =
             in_RCX;
        *(RemoveConst<kj::Exception::Detail> **)((long)PVar6.super_PromiseBase.node.ptr + -0x18) =
             pRVar16;
        *(_func_int ***)((long)PVar6.super_PromiseBase.node.ptr + -0x10) = pp_Var3;
        *(ArrayDisposer **)((long)PVar6.super_PromiseBase.node.ptr + -8) = params;
        *(long *)((long)PVar6.super_PromiseBase.node.ptr + -0x48) = lVar10;
      }
      f.exception = (Exception *)anon_var_dwarf_a0474c;
      intermediate.ptr = &pTVar14->super_PromiseNode;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                ((PromiseDisposer *)&_kjCondition,&intermediate,(SourceLocation *)&f);
      OVar7.ptr = intermediate.ptr;
      local_88.ptr = (PromiseNode *)__kjCondition;
      if (intermediate.ptr != (PromiseNode *)0x0) {
        intermediate.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar7.ptr)->super_PromiseArenaMember);
      }
      kj::_::PromiseDisposer::
      alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_long>>
                ((PromiseDisposer *)&f,(Canceler *)params,(Promise<unsigned_long> *)&local_88);
      OVar7.ptr = local_88.ptr;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = (_func_int **)f.exception;
      if (&(local_88.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
        local_88.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar7.ptr)->super_PromiseArenaMember);
      }
    }
    else {
      p_Var13 = (_func_int *)((long)in_RCX - (long)pRVar16);
      f.exception = (Exception *)&n;
      pp_Var9 = output[6]._vptr_AsyncOutputStream;
      p_Var4 = pp_Var9[(long)pp_Var18 * 2];
      lVar10 = (long)pp_Var9[(long)pp_Var18 * 2 + 1] - (long)p_Var13;
      n = (uint64_t)p_Var13;
      if (pp_Var9[(long)pp_Var18 * 2 + 1] < p_Var13) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                   ,0x288,FAILED,"n <= splitPiece.size()","_kjCondition,",
                   (DebugComparison<unsigned_long_&,_unsigned_long> *)&f);
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      if (in_RCX != pRVar16) {
        lVar5 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
        if (lVar5 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar5) < 0x38) {
          pvVar8 = operator_new(0x400);
          pTVar14 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3c8);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar14,(OwnPromiseNode *)&promise,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:653:34)>
                     ::anon_class_24_2_e72e484a_for_func::operator());
          *(undefined ***)((long)pvVar8 + 0x3c8) = &PTR_destroy_00647540;
          *(uint64_t *)((long)pvVar8 + 1000) = amount;
          *(_func_int **)((long)pvVar8 + 0x3f0) = p_Var4;
          *(_func_int **)((long)pvVar8 + 0x3f8) = p_Var13;
          *(void **)((long)pvVar8 + 0x3d0) = pvVar8;
        }
        else {
          *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
          pTVar14 = (TransformPromiseNodeBase *)((long)promise.super_PromiseBase.node.ptr + -0x38);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar14,(OwnPromiseNode *)&promise,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:653:34)>
                     ::anon_class_24_2_e72e484a_for_func::operator());
          *(undefined ***)((long)PVar6.super_PromiseBase.node.ptr + -0x38) = &PTR_destroy_00647540;
          *(uint64_t *)((long)PVar6.super_PromiseBase.node.ptr + -0x18) = amount;
          *(_func_int **)((long)PVar6.super_PromiseBase.node.ptr + -0x10) = p_Var4;
          *(_func_int **)((long)PVar6.super_PromiseBase.node.ptr + -8) = p_Var13;
          *(long *)((long)PVar6.super_PromiseBase.node.ptr + -0x30) = lVar5;
        }
        f.exception = (Exception *)&DAT_004a8171;
        intermediate.ptr = &pTVar14->super_PromiseNode;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&_kjCondition,&intermediate,(SourceLocation *)&f);
        OVar7.ptr = intermediate.ptr;
        FVar15.exception = __kjCondition;
        if (intermediate.ptr != (PromiseNode *)0x0) {
          intermediate.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(OVar7.ptr)->super_PromiseArenaMember);
        }
        PVar6.super_PromiseBase.node.ptr = promise.super_PromiseBase.node.ptr;
        promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)FVar15.exception;
        if (PVar6.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)PVar6.super_PromiseBase.node.ptr);
        }
      }
      PVar6.super_PromiseBase.node.ptr = promise.super_PromiseBase.node.ptr;
      lVar12 = (long)pp_Var3 - ((long)pp_Var18 + 1);
      pp_Var3 = output[2]._vptr_AsyncOutputStream;
      lVar5 = *(long *)((long)promise.super_PromiseBase.node.ptr + 8);
      if (lVar5 == 0 || (ulong)((long)promise.super_PromiseBase.node.ptr - lVar5) < 0x60) {
        pvVar8 = operator_new(0x400);
        pTVar14 = (TransformPromiseNodeBase *)((long)pvVar8 + 0x3a0);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar14,(OwnPromiseNode *)&promise,
                   kj::_::
                   TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:658:43),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
                   ::anon_class_48_4_354179c9_for_func::operator());
        *(undefined ***)((long)pvVar8 + 0x3a0) = &PTR_destroy_00647598;
        *(AsyncOutputStream **)((long)pvVar8 + 0x3c0) = output;
        *(_func_int **)((long)pvVar8 + 0x3c8) = p_Var4 + (long)p_Var13;
        *(long *)((long)pvVar8 + 0x3d0) = lVar10;
        *(_func_int ***)((long)pvVar8 + 0x3d8) = pp_Var9 + ((long)pp_Var18 + 1) * 2;
        *(long *)((long)pvVar8 + 0x3e0) = lVar12;
        *(RemoveConst<kj::Exception::Detail> **)((long)pvVar8 + 1000) = in_RCX;
        *(_func_int ***)((long)pvVar8 + 0x3f0) = pp_Var3;
        *(ArrayDisposer **)((long)pvVar8 + 0x3f8) = params;
        *(void **)((long)pvVar8 + 0x3a8) = pvVar8;
      }
      else {
        *(undefined8 *)((long)promise.super_PromiseBase.node.ptr + 8) = 0;
        pTVar14 = (TransformPromiseNodeBase *)((long)promise.super_PromiseBase.node.ptr + -0x60);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (pTVar14,(OwnPromiseNode *)&promise,
                   kj::_::
                   TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:658:43),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:447:12)>
                   ::anon_class_48_4_354179c9_for_func::operator());
        *(undefined ***)((long)PVar6.super_PromiseBase.node.ptr + -0x60) = &PTR_destroy_00647598;
        *(AsyncOutputStream **)((long)PVar6.super_PromiseBase.node.ptr + -0x40) = output;
        *(_func_int **)((long)PVar6.super_PromiseBase.node.ptr + -0x38) = p_Var4 + (long)p_Var13;
        *(long *)((long)PVar6.super_PromiseBase.node.ptr + -0x30) = lVar10;
        *(_func_int ***)((long)PVar6.super_PromiseBase.node.ptr + -0x28) =
             pp_Var9 + ((long)pp_Var18 + 1) * 2;
        *(long *)((long)PVar6.super_PromiseBase.node.ptr + -0x20) = lVar12;
        *(RemoveConst<kj::Exception::Detail> **)((long)PVar6.super_PromiseBase.node.ptr + -0x18) =
             in_RCX;
        *(_func_int ***)((long)PVar6.super_PromiseBase.node.ptr + -0x10) = pp_Var3;
        *(ArrayDisposer **)((long)PVar6.super_PromiseBase.node.ptr + -8) = params;
        *(long *)((long)PVar6.super_PromiseBase.node.ptr + -0x58) = lVar5;
      }
      local_48.ptr = &pTVar14->super_PromiseNode;
      kj::_::PromiseDisposer::
      alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_long>>
                ((PromiseDisposer *)&f,(Canceler *)params,(Promise<unsigned_long> *)&local_48);
      OVar7.ptr = local_48.ptr;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = (_func_int **)f.exception;
      if ((TransformPromiseNodeBase *)local_48.ptr != (TransformPromiseNodeBase *)0x0) {
        local_48.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar7.ptr)->super_PromiseArenaMember);
      }
    }
    FVar15.exception = (Exception *)promise.super_PromiseBase.node.ptr;
    if (promise.super_PromiseBase.node.ptr == (OwnPromiseNode)0x0) {
      return (PromiseBase)(PromiseBase)this;
    }
    promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
  }
  kj::_::PromiseDisposer::dispose((PromiseArenaMember *)FVar15.exception);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}